

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void rapidjson::
     SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
               (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is)

{
  MemoryStream *pMVar1;
  byte *pbVar2;
  StreamLocalCopy<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_0>
  copy;
  
  pMVar1 = is->is_;
  pbVar2 = (byte *)pMVar1->src_;
  while (((pbVar2 != (byte *)pMVar1->end_ && ((ulong)*pbVar2 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
    pbVar2 = pbVar2 + 1;
    pMVar1->src_ = (Ch *)pbVar2;
  }
  return;
}

Assistant:

void SkipWhitespace(InputStream& is) {
    internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    typename InputStream::Ch c;
    while ((c = s.Peek()) == ' ' || c == '\n' || c == '\r' || c == '\t')
        s.Take();
}